

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

int absl::lts_20240722::time_internal::cctz::detail::get_yearday(civil_second *cs)

{
  int iVar1;
  int iVar2;
  year_t y;
  bool local_4d;
  int local_48;
  int feb29;
  int k_month_offsets [13];
  civil_second *cs_local;
  
  unique0x100000b5 = cs;
  memcpy(&local_48,&DAT_001284e0,0x34);
  iVar1 = civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::month
                    (stack0xfffffffffffffff0);
  local_4d = false;
  if (2 < iVar1) {
    y = civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::year
                  (stack0xfffffffffffffff0);
    local_4d = impl::is_leap_year(y);
  }
  iVar1 = civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::month
                    (stack0xfffffffffffffff0);
  iVar1 = (&local_48)[iVar1];
  iVar2 = civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::day
                    (stack0xfffffffffffffff0);
  return iVar1 + (uint)local_4d + iVar2;
}

Assistant:

CONSTEXPR_F int get_yearday(const civil_second& cs) noexcept {
  CONSTEXPR_D int k_month_offsets[1 + 12] = {
      -1, 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334,
  };
  const int feb29 = (cs.month() > 2 && impl::is_leap_year(cs.year()));
  return k_month_offsets[cs.month()] + feb29 + cs.day();
}